

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void SparseKeygenRecurse<Blob<192>,Blob<256>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<192> *k,
               vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes)

{
  undefined1 in_CL;
  int in_EDX;
  uint32_t in_ESI;
  code *in_RDI;
  void *in_R8;
  Blob<192> *in_R9;
  int i;
  Blob<256> h;
  int nbits;
  int nbytes;
  uint32_t local_54;
  undefined1 local_50 [8];
  value_type *in_stack_ffffffffffffffb8;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 uVar2;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint start_00;
  uint32_t uVar3;
  
  start_00 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  uVar2 = 0x18;
  uVar1 = 0xc0;
  local_54 = in_ESI;
  Blob<256>::Blob((Blob<256> *)local_50);
  uVar3 = local_54;
  for (; (int)local_54 < 0xc0; local_54 = local_54 + 1) {
    flipbit(in_R8,0x18,local_54);
    if (((start_00 & 0x1000000) != 0) || (in_EDX == 1)) {
      (*in_RDI)(in_R8,0x18,0,local_50);
      std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    if (1 < in_EDX) {
      SparseKeygenRecurse<Blob<192>,Blob<256>>
                ((pfHash)CONCAT44(uVar3,in_EDX),start_00,in_stack_ffffffffffffffe8,
                 SUB81((ulong)in_R8 >> 0x38,0),in_R9,
                 (vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(uVar2,uVar1));
    }
    flipbit(in_R8,0x18,local_54);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}